

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Z80Implementation.hpp
# Opt level: O1

void __thiscall
CPU::Z80::Processor<Enterprise::ConcreteMachine<false,_false>,_false,_false>::assemble_page
          (Processor<Enterprise::ConcreteMachine<false,_false>,_false,_false> *this,
          InstructionPage *target,InstructionTable *table,bool add_offsets)

{
  long *plVar1;
  Type TVar2;
  MicroOp (*paMVar3) [30];
  Type *pTVar4;
  InstructionTable *paaMVar5;
  int c;
  long lVar6;
  MicroOp *pMVar7;
  undefined7 in_register_00000009;
  MicroOp *pMVar8;
  ulong uVar9;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *__range2;
  long lVar10;
  long lVar11;
  ulong uVar12;
  ulong uVar13;
  vector<unsigned_long,_std::allocator<unsigned_long>_> operation_indices;
  size_t lengths [256];
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_878;
  InstructionTable *local_860;
  undefined4 local_854;
  value_type local_850;
  InstructionPage *local_848;
  vector<CPU::Z80::ProcessorStorage::MicroOp,std::allocator<CPU::Z80::ProcessorStorage::MicroOp>>
  *local_840;
  ulong auStack_838 [257];
  
  local_854 = (undefined4)CONCAT71(in_register_00000009,add_offsets);
  lVar6 = 0;
  pMVar8 = (MicroOp *)table;
  lVar11 = 0;
  do {
    lVar10 = lVar11;
    uVar9 = 0;
    pMVar7 = pMVar8;
    do {
      paMVar3 = (MicroOp (*) [30])&pMVar7->type;
      uVar9 = uVar9 + 1;
      pMVar7 = pMVar7 + 1;
    } while (((*paMVar3)[0].type & ~IncrementR) != DecodeOperation);
    auStack_838[lVar6] = uVar9;
    lVar6 = lVar6 + 1;
    pMVar8 = pMVar8 + 0x1e;
    lVar11 = lVar10 + uVar9;
  } while (lVar6 != 0x100);
  local_878.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (unsigned_long *)0x0;
  local_878.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (unsigned_long *)0x0;
  local_878.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (unsigned_long *)0x0;
  local_840 = (vector<CPU::Z80::ProcessorStorage::MicroOp,std::allocator<CPU::Z80::ProcessorStorage::MicroOp>>
               *)&target->all_operations;
  local_860 = table;
  std::
  vector<CPU::Z80::ProcessorStorage::MicroOp,_std::allocator<CPU::Z80::ProcessorStorage::MicroOp>_>
  ::reserve((vector<CPU::Z80::ProcessorStorage::MicroOp,_std::allocator<CPU::Z80::ProcessorStorage::MicroOp>_>
             *)local_840,lVar10 + uVar9);
  local_850 = (value_type)0x0;
  std::
  vector<CPU::Z80::ProcessorStorage::MicroOp_*,_std::allocator<CPU::Z80::ProcessorStorage::MicroOp_*>_>
  ::resize(&target->instructions,0x100,&local_850);
  pMVar8 = (*local_860)[0] + 1;
  lVar11 = 0;
  local_848 = target;
  do {
    local_850 = (value_type)
                ((long)(local_848->all_operations).
                       super__Vector_base<CPU::Z80::ProcessorStorage::MicroOp,_std::allocator<CPU::Z80::ProcessorStorage::MicroOp>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)(local_848->all_operations).
                       super__Vector_base<CPU::Z80::ProcessorStorage::MicroOp,_std::allocator<CPU::Z80::ProcessorStorage::MicroOp>_>
                       ._M_impl.super__Vector_impl_data._M_start >> 6);
    if (local_878.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_finish ==
        local_878.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::_M_realloc_insert<unsigned_long>
                (&local_878,
                 (iterator)
                 local_878.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                 .super__Vector_impl_data._M_finish,(unsigned_long *)&local_850);
    }
    else {
      *local_878.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_finish = (unsigned_long)local_850;
      local_878.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish =
           local_878.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_finish + 1;
    }
    paaMVar5 = local_860;
    uVar9 = auStack_838[lVar11];
    if (uVar9 != 0) {
      uVar13 = 0;
      do {
        TVar2 = (*paaMVar5)[lVar11][uVar13].type;
        uVar12 = uVar13;
        if (((TVar2 != BusOperation) ||
            ((*paaMVar5)[lVar11][uVar13].machine_cycle.length.super_WrappedInt<HalfCycles>.length_
             != 0)) && ((*paaMVar5)[lVar11][uVar13].machine_cycle.was_requested == false)) {
          if ((TVar2 == IndexedPlaceHolder) && (uVar12 = uVar13 + 1, (char)local_854 == '\0')) {
            pMVar7 = pMVar8 + uVar13;
            do {
              uVar12 = uVar12 + 1;
              pTVar4 = &pMVar7->type;
              pMVar7 = pMVar7 + 1;
            } while (*pTVar4 != CalculateIndexAddress);
          }
          std::
          vector<CPU::Z80::ProcessorStorage::MicroOp,std::allocator<CPU::Z80::ProcessorStorage::MicroOp>>
          ::emplace_back<CPU::Z80::ProcessorStorage::MicroOp&>
                    (local_840,(*local_860)[lVar11] + uVar12);
        }
        uVar13 = uVar12 + 1;
      } while (uVar13 < uVar9);
    }
    lVar11 = lVar11 + 1;
    pMVar8 = pMVar8 + 0x1e;
  } while (lVar11 != 0x100);
  if (local_878.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_878.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    lVar11 = 0;
    do {
      plVar1 = (long *)((long)local_878.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_start + lVar11);
      *(pointer *)
       ((long)(local_848->instructions).
              super__Vector_base<CPU::Z80::ProcessorStorage::MicroOp_*,_std::allocator<CPU::Z80::ProcessorStorage::MicroOp_*>_>
              ._M_impl.super__Vector_impl_data._M_start + lVar11) =
           (local_848->all_operations).
           super__Vector_base<CPU::Z80::ProcessorStorage::MicroOp,_std::allocator<CPU::Z80::ProcessorStorage::MicroOp>_>
           ._M_impl.super__Vector_impl_data._M_start + *plVar1;
      lVar11 = lVar11 + 8;
    } while ((pointer)(plVar1 + 1) !=
             local_878.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_finish);
  }
  if (local_878.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (unsigned_long *)0x0) {
    operator_delete(local_878.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_878.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_878.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void Processor <T, uses_bus_request, uses_wait_line>
				::assemble_page(InstructionPage &target, InstructionTable &table, bool add_offsets) {
	std::size_t number_of_micro_ops = 0;
	std::size_t lengths[256];

	// Count number of micro-ops required.
	for(int c = 0; c < 256; c++) {
		std::size_t length = 0;
		while(!is_terminal(table[c][length].type)) length++;
		length++;
		lengths[c] = length;
		number_of_micro_ops += length;
	}

	// Allocate a landing area.
	std::vector<std::size_t> operation_indices;
	target.all_operations.reserve(number_of_micro_ops);
	target.instructions.resize(256, nullptr);

	// Copy in all programs, recording where they go.
	std::size_t destination = 0;
	for(std::size_t c = 0; c < 256; c++) {
		operation_indices.push_back(target.all_operations.size());
		for(std::size_t t = 0; t < lengths[c];) {
			// Skip zero-length bus cycles.
			if(table[c][t].type == MicroOp::BusOperation && table[c][t].machine_cycle.length.as_integral() == 0) {
				t++;
				continue;
			}

			// Skip optional waits if this instance doesn't use the wait line.
			if(table[c][t].machine_cycle.was_requested && !uses_wait_line) {
				t++;
				continue;
			}

			// If an index placeholder is hit then drop it, and if offsets aren't being added,
			// then also drop the indexing that follows, which is assumed to be everything
			// up to and including the next ::CalculateIndexAddress. Coupled to the INDEX() macro.
			if(table[c][t].type == MicroOp::IndexedPlaceHolder) {
				t++;
				if(!add_offsets) {
					while(table[c][t].type != MicroOp::CalculateIndexAddress) t++;
					t++;
				}
			}
			target.all_operations.emplace_back(table[c][t]);
			destination++;
			t++;
		}
	}

	// Since the vector won't change again, it's now safe to set pointers.
	std::size_t c = 0;
	for(std::size_t index : operation_indices) {
		target.instructions[c] = &target.all_operations[index];
		c++;
	}
}